

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operations.c
# Opt level: O2

int gb_add_hl(uint16_t value,Cpu *cpu)

{
  uint8_t *flags;
  _Bool _Var1;
  uint16_t a;
  
  flags = cpu->registers + 5;
  a = combine_bytes(cpu->registers[6],cpu->registers[7]);
  _Var1 = overflows_16bit(a,value);
  if (_Var1) {
    set_flag(flags,Flag_Carry);
  }
  else {
    clear_flag(flags,Flag_Carry);
  }
  _Var1 = half_carry_16bit(a,value);
  if (_Var1) {
    set_flag(flags,Flag_Half_Carry);
  }
  else {
    clear_flag(flags,Flag_Half_Carry);
  }
  clear_flag(flags,Flag_Sub);
  *(uint16_t *)(cpu->registers + 6) = (a + value) * 0x100 | (ushort)(a + value) >> 8;
  return 8;
}

Assistant:

int gb_add_hl(uint16_t value, Cpu* cpu) {
    
    uint8_t* flags = &(cpu->registers[Register_F]);
    uint16_t hl = combine_bytes(cpu->registers[Register_H], cpu->registers[Register_L]);

    overflows_16bit(hl, value) ? set_flag(flags, Flag_Carry) : clear_flag(flags, Flag_Carry);

    half_carry_16bit(hl, value) ? set_flag(flags, Flag_Half_Carry) : clear_flag(flags, Flag_Half_Carry);

    hl = (uint16_t) (hl + value);

    clear_flag(flags, Flag_Sub);

    cpu->registers[Register_H] =  (uint8_t)(hl >> 8u);
    cpu->registers[Register_L] =  (uint8_t)(hl & 0xFFu);

    return 8;
}